

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * compatibilityType_abi_cxx11_(string *__return_storage_ptr__,CompatibleType t)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(t) {
  case BoolType:
    __s = "Boolean compatibility";
    __a = &local_9;
    break;
  case StringType:
    __s = "String compatibility";
    __a = &local_a;
    break;
  case NumberMinType:
    __s = "Numeric minimum compatibility";
    __a = &local_c;
    break;
  case NumberMaxType:
    __s = "Numeric maximum compatibility";
    __a = &local_b;
    break;
  default:
    __assert_fail("false && \"Unreachable!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                  ,0x11a0,"std::string compatibilityType(CompatibleType)");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string compatibilityType(CompatibleType t)
{
  switch (t) {
    case BoolType:
      return "Boolean compatibility";
    case StringType:
      return "String compatibility";
    case NumberMaxType:
      return "Numeric maximum compatibility";
    case NumberMinType:
      return "Numeric minimum compatibility";
  }
  assert(false && "Unreachable!");
  return "";
}